

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_kernel_info.h
# Opt level: O0

bool __thiscall
KokkosTools::KernelTimer::KernelPerformanceInfo::readFromFile
          (KernelPerformanceInfo *this,FILE *input)

{
  size_t sVar1;
  EVP_PKEY_CTX *pEVar2;
  ulong uVar3;
  allocator *paVar4;
  string_view mangled_name;
  int local_a4;
  undefined1 auStack_a0 [4];
  uint32_t kernelT;
  undefined8 local_98;
  string local_90;
  allocator local_59;
  string local_58 [32];
  uint local_38;
  uint local_34;
  uint32_t kernelNameLength;
  uint32_t nextIndex;
  char *entry;
  uint32_t actual_read;
  uint32_t recordLen;
  FILE *input_local;
  KernelPerformanceInfo *this_local;
  
  entry._4_4_ = 0;
  _actual_read = (FILE *)input;
  input_local = (FILE *)this;
  sVar1 = fread((void *)((long)&entry + 4),4,1,(FILE *)input);
  entry._0_4_ = (int)sVar1;
  if ((int)entry == 1) {
    _kernelNameLength = (EVP_PKEY_CTX *)malloc((ulong)entry._4_4_);
    fread(_kernelNameLength,(ulong)entry._4_4_,1,_actual_read);
    local_34 = 0;
    copy(this,(EVP_PKEY_CTX *)&local_38,_kernelNameLength);
    local_34 = local_34 + 4;
    pEVar2 = _kernelNameLength + local_34;
    uVar3 = (ulong)local_38;
    paVar4 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,(char *)pEVar2,uVar3,paVar4);
    std::__cxx11::string::operator=((string *)this,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    _auStack_a0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
    mangled_name._M_len = auStack_a0._8_8_;
    mangled_name._M_str = (char *)paVar4;
    demangleNameKokkos_abi_cxx11_(&local_90,auStack_a0._0_8_,mangled_name);
    std::__cxx11::string::operator=((string *)this,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    local_34 = local_38 + local_34;
    copy(this,(EVP_PKEY_CTX *)&this->callCount,_kernelNameLength + local_34);
    local_34 = local_34 + 8;
    copy(this,(EVP_PKEY_CTX *)&this->time,_kernelNameLength + local_34);
    local_34 = local_34 + 8;
    copy(this,(EVP_PKEY_CTX *)&this->timeSq,_kernelNameLength + local_34);
    local_34 = local_34 + 8;
    local_a4 = 0;
    copy(this,(EVP_PKEY_CTX *)&local_a4,_kernelNameLength + local_34);
    local_34 = local_34 + 4;
    if (local_a4 == 0) {
      this->kType = PARALLEL_FOR;
    }
    else if (local_a4 == 1) {
      this->kType = PARALLEL_REDUCE;
    }
    else if (local_a4 == 2) {
      this->kType = PARALLEL_SCAN;
    }
    else if (local_a4 == 3) {
      this->kType = REGION;
    }
    free(_kernelNameLength);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool readFromFile(FILE* input) {
    uint32_t recordLen   = 0;
    uint32_t actual_read = fread(&recordLen, sizeof(recordLen), 1, input);
    if (actual_read != 1) return false;

    char* entry = (char*)malloc(recordLen);
    fread(entry, recordLen, 1, input);

    uint32_t nextIndex = 0;
    uint32_t kernelNameLength;
    copy((char*)&kernelNameLength, &entry[nextIndex], sizeof(kernelNameLength));
    nextIndex += sizeof(kernelNameLength);

    this->kernelName = std::string(&entry[nextIndex], kernelNameLength);

    kernelName = demangleNameKokkos(kernelName);

    nextIndex += kernelNameLength;

    copy((char*)&callCount, &entry[nextIndex], sizeof(callCount));
    nextIndex += sizeof(callCount);

    copy((char*)&time, &entry[nextIndex], sizeof(time));
    nextIndex += sizeof(time);

    copy((char*)&timeSq, &entry[nextIndex], sizeof(timeSq));
    nextIndex += sizeof(timeSq);

    uint32_t kernelT = 0;
    copy((char*)&kernelT, &entry[nextIndex], sizeof(kernelT));
    nextIndex += sizeof(kernelT);

    if (kernelT == 0) {
      kType = PARALLEL_FOR;
    } else if (kernelT == 1) {
      kType = PARALLEL_REDUCE;
    } else if (kernelT == 2) {
      kType = PARALLEL_SCAN;
    } else if (kernelT == 3) {
      kType = REGION;
    }

    free(entry);
    return true;
  }